

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O2

void Gia_ManCorrSpecReduce_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,int f,int nPrefix)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  uint uVar2;
  
  iVar1 = Gia_ObjCopyF(p,f,pObj);
  if (iVar1 != -1) {
    return;
  }
  if (nPrefix <= f) {
    iVar1 = Gia_ObjId(p,pObj);
    pObj_00 = Gia_ObjReprObj(p,iVar1);
    if (pObj_00 != (Gia_Obj_t *)0x0) {
      Gia_ManCorrSpecReduce_rec(pNew,p,pObj_00,f,nPrefix);
      iVar1 = Gia_ObjCopyF(p,f,pObj_00);
      iVar1 = Abc_LitNotCond(iVar1,((uint)((ulong)*(undefined8 *)pObj >> 0x20) ^
                                   (uint)((ulong)*(undefined8 *)pObj_00 >> 0x20)) >> 0x1f);
      goto LAB_004b8f83;
    }
  }
  uVar2 = ~*(uint *)pObj;
  if (((uVar2 & 0x9fffffff) != 0) && ((int)*(uint *)pObj < 0 || (uVar2 & 0x1fffffff) == 0)) {
    __assert_fail("Gia_ObjIsCand(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCorr.c"
                  ,0x5a,
                  "void Gia_ManCorrSpecReduce_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *, int, int)")
    ;
  }
  iVar1 = Gia_ManCorrSpecReal(pNew,p,pObj,f,nPrefix);
LAB_004b8f83:
  Gia_ObjSetCopyF(p,f,pObj,iVar1);
  return;
}

Assistant:

void Gia_ManCorrSpecReduce_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, int f, int nPrefix )
{
    Gia_Obj_t * pRepr;
    int iLitNew;
    if ( ~Gia_ObjCopyF(p, f, pObj) )
        return;
    if ( f >= nPrefix && (pRepr = Gia_ObjReprObj(p, Gia_ObjId(p, pObj))) )
    {
        Gia_ManCorrSpecReduce_rec( pNew, p, pRepr, f, nPrefix );
        iLitNew = Abc_LitNotCond( Gia_ObjCopyF(p, f, pRepr), Gia_ObjPhase(pRepr) ^ Gia_ObjPhase(pObj) );
        Gia_ObjSetCopyF( p, f, pObj, iLitNew );
        return;
    }
    assert( Gia_ObjIsCand(pObj) );
    iLitNew = Gia_ManCorrSpecReal( pNew, p, pObj, f, nPrefix );
    Gia_ObjSetCopyF( p, f, pObj, iLitNew );
}